

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

internalJSONNode * internalJSONNode::newInternal(char mytype)

{
  internalJSONNode *this;
  
  this = (internalJSONNode *)operator_new(0x98);
  internalJSONNode(this,mytype);
  return this;
}

Assistant:

internalJSONNode * internalJSONNode::newInternal(char mytype) {
	#ifdef JSON_MEMORY_POOL /*-> JSON_MEMORY_POOL */
		return new((internalJSONNode*)json_internal_mempool.allocate()) internalJSONNode(mytype);
	#elif defined(JSON_MEMORY_CALLBACKS) /*<- else JSON_MEMORY_CALLBACKS */
		return new(json_malloc<internalJSONNode>(1)) internalJSONNode(mytype);
	#else /*<- else */
		return new internalJSONNode(mytype);
	#endif /*<- */
}